

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Dam_ManCollectSets_rec(Dam_Man_t *p,int Id)

{
  uint Lit;
  int iVar1;
  undefined8 uVar2;
  uint *puVar3;
  Vec_Int_t *vVec2;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj;
  
  while( true ) {
    iVar4 = Dam_ObjHand(p,Id);
    if (Id == 0) {
      return;
    }
    if (iVar4 != 0) {
      return;
    }
    pObj = Gia_ManObj(p->pGia,Id);
    uVar2 = *(undefined8 *)pObj;
    if ((~(uint)uVar2 & 0x9fffffff) == 0) {
      return;
    }
    iVar4 = Gia_ObjIsBuf(pObj);
    if (iVar4 == 0) break;
    Id = Id - ((uint)uVar2 & 0x1fffffff);
  }
  iVar4 = Gia_ObjIsMux(p->pGia,pObj);
  if (iVar4 == 0) {
    Gia_ManSuperCollect(p->pGia,pObj,0);
    Vec_IntWriteEntry(p->vNod2Set,Id,p->vSetStore->nSize);
    Vec_IntPush(p->vSetStore,p->pGia->vSuper->nSize);
    iVar4 = Gia_ObjIsXor(pObj);
    vVec2 = p->pGia->vSuper;
    p->nAnds = p->nAnds + (vVec2->nSize + -1) * (iVar4 * 2 + 1);
    iVar4 = p->vSetStore->nSize;
    Vec_IntAppend(p->vSetStore,vVec2);
    iVar1 = p->vSetStore->nSize;
    for (; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      iVar5 = Vec_IntEntry(p->vSetStore,iVar4);
      iVar5 = Abc_Lit2Var(iVar5);
      Dam_ManCollectSets_rec(p,iVar5);
    }
  }
  else if (((uint)*(ulong *)pObj >> 0x1e & 1) == 0) {
    *(ulong *)pObj = *(ulong *)pObj | 0x40000000;
    Vec_IntPush(p->vVisit,Id);
    Dam_ManCollectSets_rec(p,Id - (*(uint *)pObj & 0x1fffffff));
    Dam_ManCollectSets_rec(p,Id - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
    puVar3 = p->pGia->pMuxes;
    iVar4 = -1;
    if ((puVar3 != (uint *)0x0) && (Lit = puVar3[Id], Lit != 0)) {
      iVar4 = Abc_Lit2Var(Lit);
    }
    Dam_ManCollectSets_rec(p,iVar4);
    p->nAnds = p->nAnds + 3;
  }
  return;
}

Assistant:

void Dam_ManCollectSets_rec( Dam_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    int i, iBeg, iEnd, iLit;
    if ( Dam_ObjHand(p, Id) || Id == 0 )
        return;
    pObj = Gia_ManObj(p->pGia, Id);
    if ( Gia_ObjIsCi(pObj) )
        return;
    if ( Gia_ObjIsBuf(pObj) )
    {
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId0(pObj, Id) );
        return;
    }
    if ( Gia_ObjIsMux(p->pGia, pObj) )
    {
        if ( pObj->fMark0 )
            return;
        pObj->fMark0 = 1;
        Vec_IntPush( p->vVisit, Id );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId0(pObj, Id) );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId1(pObj, Id) );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId2(p->pGia, Id) );
        p->nAnds += 3;
        return;
    }
    Gia_ManSuperCollect( p->pGia, pObj, 0 );
    Vec_IntWriteEntry( p->vNod2Set, Id, Vec_IntSize(p->vSetStore) );
    Vec_IntPush( p->vSetStore, Vec_IntSize(p->pGia->vSuper) );
    p->nAnds += (1 + 2 * Gia_ObjIsXor(pObj)) * (Vec_IntSize(p->pGia->vSuper) - 1);
    // save entries
    iBeg = Vec_IntSize( p->vSetStore );
    Vec_IntAppend( p->vSetStore, p->pGia->vSuper );
    iEnd = Vec_IntSize( p->vSetStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vSetStore, iLit, i, iBeg, iEnd )
        Dam_ManCollectSets_rec( p, Abc_Lit2Var(iLit) );
}